

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t ilen,uchar *input,uchar *output)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  uchar *__s;
  size_t __n;
  bool bVar6;
  
  if (mode == 1) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      return -0x4080;
    }
    if (ctx->padding != 0) {
      return -0x4080;
    }
  }
  else if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    return -0x4080;
  }
  uVar1 = ctx->len;
  iVar3 = -0x4080;
  if (ilen + 0xb <= uVar1) {
    __n = (uVar1 - ilen) - 3;
    *output = '\0';
    __s = output + 2;
    if (mode != 0) {
      output[1] = '\x01';
      if (__n != 0) {
        memset(__s,0xff,__n);
        __s = output + ~ilen + uVar1;
      }
LAB_00162317:
      *__s = '\0';
      memcpy(__s + 1,input,ilen);
      if (mode != 0) {
        iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,output,output);
        return iVar3;
      }
      iVar3 = mbedtls_rsa_public(ctx,output,output);
      return iVar3;
    }
    output[1] = '\x02';
    puVar5 = output;
    do {
      bVar6 = __n == 0;
      __n = __n - 1;
      if (bVar6) goto LAB_00162317;
      iVar3 = 100;
      do {
        iVar2 = (*f_rng)(p_rng,__s,1);
        iVar4 = iVar3;
        if ((*__s != '\0') || (iVar4 = iVar3 + -1, iVar3 == 1)) break;
        iVar3 = iVar4;
      } while (iVar2 == 0);
      bVar6 = iVar2 == 0 && iVar4 != 0;
      __s = __s + bVar6;
      puVar5 = (uchar *)((ulong)puVar5 & 0xffffffff);
      if (iVar2 != 0 || iVar4 == 0) {
        puVar5 = (uchar *)(ulong)(iVar2 - 0x4480);
      }
      iVar3 = (int)puVar5;
    } while (bVar6);
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode, size_t ilen,
                                 const unsigned char *input,
                                 unsigned char *output )
{
    size_t nb_pad, olen;
    int ret;
    unsigned char *p = output;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( f_rng == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;

    if( olen < ilen + 11 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    nb_pad = olen - 3 - ilen;

    *p++ = 0;
    if( mode == MBEDTLS_RSA_PUBLIC )
    {
        *p++ = MBEDTLS_RSA_CRYPT;

        while( nb_pad-- > 0 )
        {
            int rng_dl = 100;

            do {
                ret = f_rng( p_rng, p, 1 );
            } while( *p == 0 && --rng_dl && ret == 0 );

            // Check if RNG failed to generate data
            //
            if( rng_dl == 0 || ret != 0 )
                return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

            p++;
        }
    }
    else
    {
        *p++ = MBEDTLS_RSA_SIGN;

        while( nb_pad-- > 0 )
            *p++ = 0xFF;
    }

    *p++ = 0;
    memcpy( p, input, ilen );

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, output, output )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, output, output ) );
}